

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O2

string * __thiscall
ROM::Description::description_abi_cxx11_(string *__return_storage_ptr__,Description *this,int flags)

{
  pointer pbVar1;
  uint uVar2;
  bool bVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file_name;
  pointer pbVar7;
  uint uVar8;
  stringstream output;
  long local_1a8 [3];
  uint auStack_190 [88];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&output);
  uVar8 = flags & 0xfffffffd;
  if ((this->crc32s)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    uVar8 = flags;
  }
  if ((uVar8 & 4) == 0) {
    std::operator<<((ostream *)local_1a8,(string *)&this->descriptive_name);
    if (uVar8 != 0) {
      std::operator<<((ostream *)local_1a8," (");
LAB_0036dab3:
      if ((uVar8 & 1) != 0) {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::operator<<(poVar4," bytes");
        uVar2 = uVar8 & 0xfffffffa;
        uVar8 = uVar8 & 0xfffffffa;
        if (uVar2 == 0) goto LAB_0036dba0;
        std::operator<<((ostream *)local_1a8,"; ");
      }
      if ((uVar8 & 2) != 0) {
        pcVar6 = "usual crc32: ";
        if (1 < (this->crc32s)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          pcVar6 = "usual crc32s: ";
        }
        std::operator<<((ostream *)local_1a8,pcVar6);
        p_Var5 = (this->crc32s)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar3 = true;
        while ((_Rb_tree_header *)p_Var5 != &(this->crc32s)._M_t._M_impl.super__Rb_tree_header) {
          if (!bVar3) {
            std::operator<<((ostream *)local_1a8,", ");
          }
          *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
               *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
          poVar4 = std::operator<<((ostream *)local_1a8,0x30);
          *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
          std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
          bVar3 = false;
        }
        if ((uVar8 & 0xfffffffd) == 0) {
          std::operator<<((ostream *)local_1a8,")");
          std::__cxx11::stringbuf::str();
          goto LAB_0036dbcc;
        }
      }
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)local_1a8,(string *)&this->machine_name);
    std::operator<<(poVar4,'/');
    pbVar7 = (this->file_names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(this->file_names).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 == 0x20) {
      std::operator<<((ostream *)local_1a8,(string *)pbVar7);
    }
    else {
      std::operator<<((ostream *)local_1a8,"{");
      pbVar1 = (this->file_names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar3 = true;
      for (pbVar7 = (this->file_names).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1
          ) {
        if (!bVar3) {
          std::operator<<((ostream *)local_1a8," or ");
        }
        std::operator<<((ostream *)local_1a8,(string *)pbVar7);
        bVar3 = false;
      }
      std::operator<<((ostream *)local_1a8,"}");
    }
    poVar4 = std::operator<<((ostream *)local_1a8," (");
    std::operator<<(poVar4,(string *)&this->descriptive_name);
    uVar2 = uVar8 & 0xfffffffb;
    uVar8 = uVar8 & 0xfffffffb;
    if (uVar2 != 0) {
      std::operator<<((ostream *)local_1a8,"; ");
      goto LAB_0036dab3;
    }
LAB_0036dba0:
    std::operator<<((ostream *)local_1a8,")");
  }
  std::__cxx11::stringbuf::str();
LAB_0036dbcc:
  std::__cxx11::stringstream::~stringstream((stringstream *)&output);
  return __return_storage_ptr__;
}

Assistant:

std::string Description::description(int flags) const {
	std::stringstream output;

	// If there are no CRCs, don't output them.
	if(crc32s.empty()) flags &= ~DescriptionFlag::CRC;

	// Print the file name(s) and the descriptive name.
	if(flags & DescriptionFlag::Filename) {
		flags &= ~DescriptionFlag::Filename;

		output << machine_name << '/';
		if(file_names.size() == 1) {
			output << file_names[0];
		} else {
			output << "{";
			bool is_first = true;
			for(const auto &file_name: file_names) {
				if(!is_first) output << " or ";
				output << file_name;
				is_first = false;
			}
			output << "}";
		}
		output << " (" << descriptive_name;
		if(!flags) {
			output << ")";
			return output.str();
		}
		output << "; ";
	} else {
		output << descriptive_name;
		if(!flags) {
			return output.str();
		}
		output << " (";
	}

	// Print the size.
	if(flags & DescriptionFlag::Size) {
		flags &= ~DescriptionFlag::Size;
		output << size << " bytes";

		if(!flags) {
			output << ")";
			return output.str();
		}
		output << "; ";
	}

	// Print the CRC(s).
	if(flags & DescriptionFlag::CRC) {
		flags &= ~DescriptionFlag::CRC;

		output << ((crc32s.size() > 1) ? "usual crc32s: " : "usual crc32: ");
		bool is_first = true;
		for(const auto crc32: crc32s) {
			if(!is_first) output << ", ";
			is_first = false;
			output << std::hex << std::setfill('0') << std::setw(8) << crc32;
		}

		if(!flags) {
			output << ")";
			return output.str();
		}
	}

	return output.str();
}